

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::OP_LdFrameDisplaySlot
          (InterpreterStackFrame *this,Var instance,int32 slotIndex)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  functionId = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(this + 0x88));
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ClosureRangeCheckPhase,sourceContextId,
                            functionId);
  if ((!bVar1) && ((ulong)*(ushort *)((long)instance + 2) <= (long)slotIndex - 1U)) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  return *(Var *)((long)instance + (long)slotIndex * 8);
}

Assistant:

Var InterpreterStackFrame::OP_LdFrameDisplaySlot(Var instance, int32 slotIndex)
    {
        if (!PHASE_OFF(ClosureRangeCheckPhase, this->m_functionBody))
        {
            if (((FrameDisplay*)instance)->GetLength() <= slotIndex - Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Var))
            {
                Js::Throw::FatalInternalError();
            }
        }
        return ((Var*)instance)[slotIndex];
    }